

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.cc
# Opt level: O1

Slice leveldb::test::CompressibleString
                (Random *rnd,double compressed_fraction,size_t len,string *dst)

{
  int iVar1;
  int len_00;
  undefined1 auVar2 [16];
  Slice SVar3;
  string raw_data;
  string local_38;
  
  auVar2._8_4_ = (int)(len >> 0x20);
  auVar2._0_8_ = len;
  auVar2._12_4_ = 0x45300000;
  iVar1 = (int)(((auVar2._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)len) - 4503599627370496.0)) * compressed_fraction)
  ;
  len_00 = 1;
  if (1 < iVar1) {
    len_00 = iVar1;
  }
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  RandomString(rnd,len_00,&local_38);
  dst->_M_string_length = 0;
  *(dst->_M_dataplus)._M_p = '\0';
  while (dst->_M_string_length < len) {
    std::__cxx11::string::_M_append((char *)dst,(ulong)local_38._M_dataplus._M_p);
  }
  std::__cxx11::string::resize((ulong)dst,(char)len);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  SVar3.data_ = (dst->_M_dataplus)._M_p;
  SVar3.size_ = dst->_M_string_length;
  return SVar3;
}

Assistant:

Slice CompressibleString(Random* rnd, double compressed_fraction, size_t len,
                         std::string* dst) {
  int raw = static_cast<int>(len * compressed_fraction);
  if (raw < 1) raw = 1;
  std::string raw_data;
  RandomString(rnd, raw, &raw_data);

  // Duplicate the random data until we have filled "len" bytes
  dst->clear();
  while (dst->size() < len) {
    dst->append(raw_data);
  }
  dst->resize(len);
  return Slice(*dst);
}